

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target)

{
  size_t sVar1;
  uint8_t *puVar2;
  EpsCopyOutputStream stream;
  EpsCopyOutputStream local_50;
  
  sVar1 = ComputeUnknownFieldsSize(unknown_fields);
  local_50.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  local_50.end_ = target + (int)sVar1;
  local_50.buffer_end_ = (uint8_t *)0x0;
  local_50.stream_ = (ZeroCopyOutputStream *)0x0;
  local_50.had_error_ = false;
  local_50.aliasing_enabled_ = false;
  local_50.skip_check_consistency = false;
  puVar2 = InternalSerializeUnknownFieldsToArray(unknown_fields,target,&local_50);
  return puVar2;
}

Assistant:

static uint8_t* SerializeUnknownFieldsToArray(
      const UnknownFieldSet& unknown_fields, uint8_t* target) {
    io::EpsCopyOutputStream stream(
        target, static_cast<int>(ComputeUnknownFieldsSize(unknown_fields)),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    return InternalSerializeUnknownFieldsToArray(unknown_fields, target,
                                                 &stream);
  }